

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareComponents
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint vertex,GLuint argument,
          GLubyte *buffer)

{
  functionEnum fVar1;
  undefined1 auVar2 [16];
  _variable_type _Var3;
  uint uVar4;
  _variable_type type;
  uint uVar5;
  TestError *this_00;
  int iVar6;
  ulong uVar7;
  GLuint *argument_dst;
  ulong uVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  GLuint argument_step [3];
  GLuint argument_reset [3];
  GLuint argument_index [3];
  uint local_88 [4];
  uint local_78 [4];
  double local_68 [3];
  uint local_50 [4];
  double local_40;
  double local_38;
  
  local_50[2] = 0;
  local_50[0] = 0;
  local_50[1] = 0;
  local_78[2] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_88[2] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_68[2] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  _Var3 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)argument);
  _Var3 = Utils::getBaseVariableType(_Var3);
  uVar4 = (*function_object->_vptr_functionObject[3])(function_object);
  type = (*function_object->_vptr_functionObject[4])(function_object,(ulong)argument);
  uVar5 = Utils::getNumberOfComponentsForVariableType(type);
  auVar2 = _DAT_019ec5b0;
  uVar7 = (ulong)uVar5;
  if (uVar4 == 3) {
    local_88[0] = 0x40;
    local_88[1] = 8;
    local_88[2] = 1;
    local_78[0] = 0x10;
    local_78[1] = 8;
    local_78[2] = 8;
    local_68[0] = -7.5;
    local_68[1] = -3.5;
    local_68[2] = -3.5;
  }
  else if (uVar4 == 2) {
    local_88[0] = 0x20;
    local_88[1] = 1;
    local_78[0] = 0x20;
    local_78[1] = 0x20;
    local_68[0] = -15.5;
    local_68[1] = -15.5;
  }
  else {
    if (uVar4 != 1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x399b);
      goto LAB_00942414;
    }
    local_88[0] = 1;
    local_78[0] = 0x400;
    local_68[0] = -511.5;
  }
  fVar1 = function_object->m_function_enum;
  if (fVar1 - FUNCTION_CLAMP < 2) {
    local_68[2] = 4.5;
LAB_0094217b:
  }
  else {
    if (fVar1 - FUNCTION_SMOOTHSTEP < 2) {
      local_88[0] = 1;
      local_88[1] = 8;
      local_88[2] = 0x40;
      local_78[0] = 8;
      local_78[1] = 8;
      local_78[2] = 0x10;
      local_68[0] = -3.5;
      local_68[1] = 4.5;
      local_68[2] = -7.5;
      goto LAB_0094217b;
    }
    if (fVar1 == FUNCTION_INVERSESQRT) {
      local_68[0] = 16.5;
    }
  }
  uVar8 = 0;
  do {
    local_50[uVar8] = (uint)(((ulong)vertex / (ulong)local_88[uVar8]) % (ulong)local_78[uVar8]);
    uVar8 = uVar8 + 1;
  } while (uVar4 != uVar8);
  if (_Var3 == VARIABLE_TYPE_DOUBLE) {
    dVar9 = (double)local_50[argument] + local_68[argument];
    uVar8 = 0;
    local_40 = dVar9;
    do {
      local_38 = (double)(int)uVar8 * 0.125 + dVar9;
      if (fVar1 == FUNCTION_ROUND) {
        dVar10 = floor(local_38);
        dVar9 = local_40;
        if ((local_38 - dVar10 == 0.5) && (!NAN(local_38 - dVar10))) {
          local_38 = local_38 + 0.01;
        }
      }
      *(double *)(buffer + uVar8 * 8) = local_38;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  else if (_Var3 == VARIABLE_TYPE_UINT) {
    uVar4 = local_50[argument];
    lVar13 = uVar7 - 1;
    auVar12._8_4_ = (int)lVar13;
    auVar12._0_8_ = lVar13;
    auVar12._12_4_ = (int)((ulong)lVar13 >> 0x20);
    uVar8 = 0;
    auVar12 = auVar12 ^ _DAT_019ec5b0;
    auVar14 = _DAT_019f34d0;
    do {
      auVar15 = auVar14 ^ auVar2;
      if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                  auVar12._4_4_ < auVar15._4_4_) & 1)) {
        *(uint *)(buffer + uVar8) = uVar4;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        *(uint *)(buffer + uVar8 + 4) = uVar4 + 1;
      }
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar13 + 2;
      uVar8 = uVar8 + 8;
      uVar4 = uVar4 + 2;
    } while ((uVar7 * 4 + 4 & 0xfffffffffffffff8) != uVar8);
  }
  else {
    if (_Var3 != VARIABLE_TYPE_INT) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x39f7);
LAB_00942414:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar13 = uVar7 - 1;
    auVar11._8_4_ = (int)lVar13;
    auVar11._0_8_ = lVar13;
    auVar11._12_4_ = (int)((ulong)lVar13 >> 0x20);
    iVar6 = -4;
    uVar8 = 0;
    auVar11 = auVar11 ^ _DAT_019ec5b0;
    auVar15 = _DAT_019f34d0;
    do {
      auVar14 = auVar15 ^ auVar2;
      if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                  auVar11._4_4_ < auVar14._4_4_) & 1)) {
        *(int *)(buffer + uVar8) = iVar6;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        *(int *)(buffer + uVar8 + 4) = iVar6 + 1;
      }
      lVar13 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar13 + 2;
      uVar8 = uVar8 + 8;
      iVar6 = iVar6 + 2;
    } while ((uVar7 * 4 + 4 & 0xfffffffffffffff8) != uVar8);
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareComponents(const functionObject& function_object, glw::GLuint vertex,
											glw::GLuint argument, glw::GLubyte* buffer)
{
	glw::GLuint					argument_index[3]		 = { 0 };
	glw::GLuint					argument_reset[3]		 = { 0 };
	glw::GLuint					argument_step[3]		 = { 0 };
	glw::GLdouble				double_argument_start[3] = { 0.0 };
	const Utils::_variable_type base_arg_type = Utils::getBaseVariableType(function_object.getArgumentType(argument));
	glw::GLuint					int_argument_start  = -4;
	const glw::GLuint			n_arguments			= function_object.getArgumentCount();
	const glw::GLuint			n_components		= function_object.getArgumentComponents(argument);
	glw::GLuint					uint_argument_start = 0;

	switch (n_arguments)
	{
	case 1:
		argument_step[0]		 = 1;
		argument_reset[0]		 = 1024;
		double_argument_start[0] = -511.5;
		break;
	case 2:
		argument_step[0]		 = 32;
		argument_step[1]		 = 1;
		argument_reset[0]		 = 32;
		argument_reset[1]		 = 32;
		double_argument_start[0] = -15.5;
		double_argument_start[1] = -15.5;
		break;
	case 3:
		argument_step[0]		 = 64;
		argument_step[1]		 = 8;
		argument_step[2]		 = 1;
		argument_reset[0]		 = 16;
		argument_reset[1]		 = 8;
		argument_reset[2]		 = 8;
		double_argument_start[0] = -7.5;
		double_argument_start[1] = -3.5;
		double_argument_start[2] = -3.5;
		break;
	default:
		TCU_FAIL("Not implemented");
		return;
		break;
	};

	switch (function_object.getFunctionEnum())
	{
	case FUNCTION_CLAMP: /* arg_2 must be less than arg_3 */
	case FUNCTION_CLAMP_AGAINST_SCALAR:
		double_argument_start[2] = 4.5;
		break;
	case FUNCTION_INVERSESQRT: /* inversesqrt is undefined for argument <= 0 */
		double_argument_start[0] = 16.5;
		break;
	case FUNCTION_SMOOTHSTEP: /* arg_1 must be less than arg_2 */
	case FUNCTION_SMOOTHSTEP_AGAINST_SCALAR:
		argument_step[0]		 = 1;
		argument_step[1]		 = 8;
		argument_step[2]		 = 64;
		argument_reset[0]		 = 8;
		argument_reset[1]		 = 8;
		argument_reset[2]		 = 16;
		double_argument_start[0] = -3.5;
		double_argument_start[1] = 4.5;
		double_argument_start[2] = -7.5;
		break;
	default:
		break;
	}

	for (glw::GLuint i = 0; i < n_arguments; ++i)
	{
		argument_index[i] = (vertex / argument_step[i]) % argument_reset[i];
	}

	switch (base_arg_type)
	{
	case Utils::VARIABLE_TYPE_DOUBLE:
	{
		glw::GLdouble* argument_dst = (glw::GLdouble*)buffer;

		double_argument_start[argument] += argument_index[argument];

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			glw::GLdouble value = double_argument_start[argument] + ((glw::GLdouble)component) / 8.0;

			switch (function_object.getFunctionEnum())
			{
			case FUNCTION_ROUND: /* Result for 0.5 depends on implementation */
				if (0.5 == Math::fract(value))
				{
					value += 0.01;
				}
				break;
			default:
				break;
			}

			argument_dst[component] = value;
		}
	}
	break;
	case Utils::VARIABLE_TYPE_INT:
	{
		glw::GLint* argument_dst = (glw::GLint*)buffer;

		uint_argument_start += argument_index[argument];

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLint value = int_argument_start + component;

			argument_dst[component] = value;
		}
	}
	break;
	case Utils::VARIABLE_TYPE_UINT:
	{
		glw::GLuint* argument_dst = (glw::GLuint*)buffer;

		uint_argument_start += argument_index[argument];

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLuint value = uint_argument_start + component;

			argument_dst[component] = value;
		}
	}
	break;
	default:
		TCU_FAIL("Not implemented");
		return;
		break;
	}
}